

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_float>_>
::~BuiltinPrecisionCaseTestInstance
          (BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_float>_>
           *this)

{
  deInt32 *pdVar1;
  ShaderExecutor *pSVar2;
  SharedPtrStateBase *pSVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BuiltinPrecisionCaseTestInstance_00d07e98;
  pSVar2 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  if (pSVar2 != (ShaderExecutor *)0x0) {
    (*pSVar2->_vptr_ShaderExecutor[1])();
    (this->m_executor).
    super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
    .m_data.ptr = (ShaderExecutor *)0x0;
  }
  pSVar3 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar3->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr = (Statement *)0x0;
      (*((this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar3 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state;
      if (pSVar3 != (SharedPtrStateBase *)0x0) {
        (*pSVar3->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  Variables<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_float>_>
  ::~Variables(&this->m_variables);
  pcVar4 = (this->m_caseCtx).name._M_dataplus._M_p;
  paVar5 = &(this->m_caseCtx).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

BuiltinPrecisionCaseTestInstance	(Context&						context,
																		 const CaseContext				caseCtx,
																		 const ShaderSpec&				shaderSpec,
																		 const Variables<In, Out>		variables,
																		 const Samplings<In>&			samplings,
																		 const StatementP				stmt)
										: TestInstance	(context)
										, m_caseCtx		(caseCtx)
										, m_variables	(variables)
										, m_samplings	(samplings)
										, m_stmt		(stmt)
										, m_executor	(createExecutor(context, caseCtx.shaderType, shaderSpec))
									{
									}